

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

void xmlParsePI(xmlParserCtxtPtr ctxt)

{
  byte bVar1;
  xmlParserInputState xVar2;
  processingInstructionSAXFunc p_Var3;
  int iVar4;
  uint val;
  int iVar5;
  xmlCatalogAllow xVar6;
  xmlChar *pxVar7;
  byte *str1;
  xmlChar *pxVar8;
  void *pvVar9;
  xmlParserInputPtr pxVar10;
  byte *str2;
  ulong uVar11;
  byte *pbVar12;
  byte *pbVar13;
  ulong uVar14;
  int l;
  xmlChar *local_48;
  int local_3c;
  ulong local_38;
  
  uVar14 = 1000000000;
  if (((uint)ctxt->options >> 0x13 & 1) == 0) {
    uVar14 = 10000000;
  }
  pxVar10 = ctxt->input;
  pxVar7 = pxVar10->cur;
  if (*pxVar7 != '<') {
    return;
  }
  if (pxVar7[1] != '?') {
    return;
  }
  iVar4 = pxVar10->id;
  xVar2 = ctxt->instate;
  ctxt->instate = XML_PARSER_PI;
  pxVar10->cur = pxVar7 + 2;
  pxVar10->col = pxVar10->col + 2;
  if (pxVar7[2] == '\0') {
    xmlParserInputGrow(pxVar10,0xfa);
  }
  if (ctxt->progressive == 0) {
    pxVar10 = ctxt->input;
    if ((500 < (long)pxVar10->cur - (long)pxVar10->base) &&
       ((long)pxVar10->end - (long)pxVar10->cur < 500)) {
      xmlSHRINK(ctxt);
    }
  }
  pxVar7 = xmlParsePITarget(ctxt);
  if (pxVar7 == (xmlChar *)0x0) {
    xmlFatalErr(ctxt,XML_ERR_PI_NOT_STARTED,(char *)0x0);
  }
  else {
    pxVar10 = ctxt->input;
    pxVar8 = pxVar10->cur;
    if ((*pxVar8 != '?') || (pxVar8[1] != '>')) {
      uVar11 = 100;
      local_3c = iVar4;
      str1 = (byte *)(*xmlMallocAtomic)(100);
      if (str1 == (byte *)0x0) {
        xmlErrMemory(ctxt,(char *)0x0);
        goto LAB_00159aa7;
      }
      local_38 = uVar14;
      iVar4 = xmlSkipBlankChars(ctxt);
      if (iVar4 == 0) {
        xmlFatalErrMsgStr(ctxt,XML_ERR_SPACE_REQUIRED,"ParsePI: PI %s space expected\n",pxVar7);
      }
      local_48 = pxVar7;
      val = xmlCurrentChar(ctxt,&l);
      iVar4 = 0;
      uVar14 = 0;
LAB_00159853:
      if (0xff < (int)val) {
        if (0xfffff < val - 0x10000 && (0x1ffd < val - 0xe000 && 0xd7ff < val)) {
LAB_00159abd:
          str1[uVar14] = 0;
          xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"ParsePI: PI %s never end ...\n",local_48);
          goto LAB_00159ae9;
        }
LAB_001598c9:
        pbVar13 = str1;
        if (uVar11 <= uVar14 + 5) {
          uVar11 = uVar11 * 2;
          pbVar13 = (byte *)(*xmlRealloc)(str1,uVar11);
          if (pbVar13 == (byte *)0x0) {
            xmlErrMemory(ctxt,(char *)0x0);
            (*xmlFree)(str1);
            ctxt->instate = xVar2;
            return;
          }
        }
        if (iVar4 < 0x32) {
          iVar4 = iVar4 + 1;
        }
        else {
          if (ctxt->progressive == 0) {
            pxVar10 = ctxt->input;
            if (((((long)pxVar10->cur - (long)pxVar10->base < 0x1f5) ||
                 (499 < (long)pxVar10->end - (long)pxVar10->cur)) ||
                (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
               ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
              xmlGROW(ctxt);
            }
          }
          iVar4 = 0;
          if (ctxt->instate == XML_PARSER_EOF) {
            (*xmlFree)(pbVar13);
            return;
          }
        }
        if (l == 1) {
          pbVar13[uVar14] = (byte)val;
          uVar14 = uVar14 + 1;
        }
        else {
          iVar5 = xmlCopyCharMultiByte(pbVar13 + uVar14,val);
          uVar14 = uVar14 + (long)iVar5;
        }
        pxVar10 = ctxt->input;
        if (*pxVar10->cur == '\n') {
          pxVar10->line = pxVar10->line + 1;
          pxVar10->col = 1;
        }
        else {
          pxVar10->col = pxVar10->col + 1;
        }
        pxVar10->cur = pxVar10->cur + l;
        val = xmlCurrentChar(ctxt,&l);
        if (val == 0) {
          if (ctxt->progressive == 0) {
            pxVar10 = ctxt->input;
            if (((((long)pxVar10->cur - (long)pxVar10->base < 0x1f5) ||
                 (499 < (long)pxVar10->end - (long)pxVar10->cur)) ||
                (xmlSHRINK(ctxt), ctxt->progressive == 0)) &&
               ((long)ctxt->input->end - (long)ctxt->input->cur < 0xfa)) {
              xmlGROW(ctxt);
            }
          }
          val = xmlCurrentChar(ctxt,&l);
        }
        str1 = pbVar13;
        if (local_38 < uVar14) {
          xmlFatalErrMsgStr(ctxt,XML_ERR_PI_NOT_FINISHED,"PI %s too big found",local_48);
          (*xmlFree)(pbVar13);
          ctxt->instate = xVar2;
          return;
        }
        goto LAB_00159853;
      }
      if ((int)val < 0x20) {
        if ((0xd < val) || ((0x2600U >> (val & 0x1f) & 1) == 0)) goto LAB_00159abd;
        goto LAB_001598c9;
      }
      if ((val != 0x3f) || (ctxt->input->cur[1] != '>')) goto LAB_001598c9;
      str1[uVar14] = 0;
      pxVar10 = ctxt->input;
      if (local_3c != pxVar10->id) {
        xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                       "PI declaration doesn\'t start and stop in the same entity\n");
        pxVar10 = ctxt->input;
      }
      pxVar7 = pxVar10->cur;
      pxVar10->cur = pxVar7 + 2;
      pxVar10->col = pxVar10->col + 2;
      if (pxVar7[2] == '\0') {
        xmlParserInputGrow(pxVar10,0xfa);
      }
      pxVar7 = local_48;
      if (((1 < (uint)xVar2) ||
          (iVar4 = xmlStrEqual(local_48,(xmlChar *)"oasis-xml-catalog"), iVar4 == 0)) ||
         (xVar6 = xmlCatalogGetDefaults(), pbVar13 = str1,
         (xVar6 & ~XML_CATA_ALLOW_GLOBAL) != XML_CATA_ALLOW_DOCUMENT)) goto LAB_00159c2c;
      while (((ulong)*pbVar13 < 0x21 && ((0x100002600U >> ((ulong)*pbVar13 & 0x3f) & 1) != 0))) {
        pbVar13 = pbVar13 + 1;
      }
      str2 = str1;
      iVar4 = xmlStrncmp(pbVar13,"catalog",7);
      if (iVar4 != 0) {
        pxVar8 = (xmlChar *)0x0;
        goto LAB_00159bfe;
      }
      for (pbVar13 = pbVar13 + 9; uVar14 = (ulong)pbVar13[-2], uVar14 < 0x3e; pbVar13 = pbVar13 + 1)
      {
        if ((0x100002600U >> (uVar14 & 0x3f) & 1) == 0) {
          if (uVar14 == 0x3d) goto LAB_00159c99;
          break;
        }
      }
      goto LAB_00159c2c;
    }
    if (iVar4 != pxVar10->id) {
      xmlFatalErrMsg(ctxt,XML_ERR_ENTITY_BOUNDARY,
                     "PI declaration doesn\'t start and stop in the same entity\n");
      pxVar10 = ctxt->input;
      pxVar8 = pxVar10->cur;
    }
    pxVar10->cur = pxVar8 + 2;
    pxVar10->col = pxVar10->col + 2;
    if (pxVar8[2] == '\0') {
      xmlParserInputGrow(pxVar10,0xfa);
    }
    if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
       (p_Var3 = ctxt->sax->processingInstruction, p_Var3 != (processingInstructionSAXFunc)0x0)) {
      (*p_Var3)(ctxt->userData,pxVar7,(xmlChar *)0x0);
    }
  }
  goto LAB_00159a92;
LAB_00159c99:
  uVar14 = (ulong)pbVar13[-1];
  if (0x27 < uVar14) goto LAB_00159cfb;
  if ((0x100002600U >> (uVar14 & 0x3f) & 1) == 0) {
    if ((0x8400000000U >> (uVar14 & 0x3f) & 1) != 0) {
      iVar4 = -1;
      pbVar12 = pbVar13;
      goto LAB_00159cc5;
    }
    goto LAB_00159cfb;
  }
  pbVar13 = pbVar13 + 1;
  goto LAB_00159c99;
  while (bVar1 != pbVar13[-1]) {
LAB_00159cc5:
    bVar1 = *pbVar12;
    pbVar12 = pbVar12 + 1;
    iVar4 = iVar4 + 1;
    if (bVar1 == 0) break;
  }
  if (bVar1 == 0) {
LAB_00159cfb:
    pxVar8 = (xmlChar *)0x0;
    str2 = str1;
    pxVar7 = local_48;
  }
  else {
    str2 = str1;
    pxVar8 = xmlStrndup(pbVar13,iVar4);
    pxVar7 = local_48;
    for (; uVar14 = (ulong)*pbVar12, uVar14 < 0x21; pbVar12 = pbVar12 + 1) {
      if ((0x100002600U >> (uVar14 & 0x3f) & 1) == 0) {
        if (uVar14 == 0) {
          if (pxVar8 == (xmlChar *)0x0) goto LAB_00159c2c;
          pvVar9 = xmlCatalogAddLocal(ctxt->catalogs,pxVar8);
          ctxt->catalogs = pvVar9;
          goto LAB_00159c1d;
        }
        break;
      }
    }
  }
LAB_00159bfe:
  xmlWarningMsg(ctxt,XML_WAR_CATALOG_PI,"Catalog PI syntax error: %s\n",str1,str2);
  if (pxVar8 != (xmlChar *)0x0) {
LAB_00159c1d:
    (*xmlFree)(pxVar8);
  }
LAB_00159c2c:
  if (((ctxt->sax != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) &&
     (p_Var3 = ctxt->sax->processingInstruction, p_Var3 != (processingInstructionSAXFunc)0x0)) {
    (*p_Var3)(ctxt->userData,pxVar7,str1);
  }
LAB_00159ae9:
  (*xmlFree)(str1);
LAB_00159a92:
  if (ctxt->instate == XML_PARSER_EOF) {
    return;
  }
LAB_00159aa7:
  ctxt->instate = xVar2;
  return;
}

Assistant:

void
xmlParsePI(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    size_t len = 0;
    size_t size = XML_PARSER_BUFFER_SIZE;
    size_t maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                       XML_MAX_HUGE_LENGTH :
                       XML_MAX_TEXT_LENGTH;
    int cur, l;
    const xmlChar *target;
    xmlParserInputState state;
    int count = 0;

    if ((RAW == '<') && (NXT(1) == '?')) {
	int inputid = ctxt->input->id;
	state = ctxt->instate;
        ctxt->instate = XML_PARSER_PI;
	/*
	 * this is a Processing Instruction.
	 */
	SKIP(2);
	SHRINK;

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = xmlParsePITarget(ctxt);
	if (target != NULL) {
	    if ((RAW == '?') && (NXT(1) == '>')) {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		if (ctxt->instate != XML_PARSER_EOF)
		    ctxt->instate = state;
		return;
	    }
	    buf = (xmlChar *) xmlMallocAtomic(size);
	    if (buf == NULL) {
		xmlErrMemory(ctxt, NULL);
		ctxt->instate = state;
		return;
	    }
	    if (SKIP_BLANKS == 0) {
		xmlFatalErrMsgStr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target);
	    }
	    cur = CUR_CHAR(l);
	    while (IS_CHAR(cur) && /* checked */
		   ((cur != '?') || (NXT(1) != '>'))) {
		if (len + 5 >= size) {
		    xmlChar *tmp;
                    size_t new_size = size * 2;
		    tmp = (xmlChar *) xmlRealloc(buf, new_size);
		    if (tmp == NULL) {
			xmlErrMemory(ctxt, NULL);
			xmlFree(buf);
			ctxt->instate = state;
			return;
		    }
		    buf = tmp;
                    size = new_size;
		}
		count++;
		if (count > 50) {
		    SHRINK;
		    GROW;
                    if (ctxt->instate == XML_PARSER_EOF) {
                        xmlFree(buf);
                        return;
                    }
		    count = 0;
		}
		COPY_BUF(l,buf,len,cur);
		NEXTL(l);
		cur = CUR_CHAR(l);
		if (cur == 0) {
		    SHRINK;
		    GROW;
		    cur = CUR_CHAR(l);
		}
                if (len > maxLength) {
                    xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
                                      "PI %s too big found", target);
                    xmlFree(buf);
                    ctxt->instate = state;
                    return;
                }
	    }
	    buf[len] = 0;
	    if (cur != '?') {
		xmlFatalErrMsgStr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target);
	    } else {
		if (inputid != ctxt->input->id) {
		    xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_BOUNDARY,
	                           "PI declaration doesn't start and stop in"
                                   " the same entity\n");
		}
		SKIP(2);

#ifdef LIBXML_CATALOG_ENABLED
		if (((state == XML_PARSER_MISC) ||
	             (state == XML_PARSER_START)) &&
		    (xmlStrEqual(target, XML_CATALOG_PI))) {
		    xmlCatalogAllow allow = xmlCatalogGetDefaults();
		    if ((allow == XML_CATA_ALLOW_DOCUMENT) ||
			(allow == XML_CATA_ALLOW_ALL))
			xmlParseCatalogPI(ctxt, buf);
		}
#endif


		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    xmlFatalErr(ctxt, XML_ERR_PI_NOT_STARTED, NULL);
	}
	if (ctxt->instate != XML_PARSER_EOF)
	    ctxt->instate = state;
    }
}